

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O0

uint SOIL_load_OGL_HDR_texture
               (char *filename,int fake_HDR_format,int rescale_to_max,uint reuse_texture_ID,
               uint flags)

{
  uint uVar1;
  int local_3c;
  uint tex_id;
  int channels;
  int height;
  int width;
  uchar *img;
  uint flags_local;
  uint reuse_texture_ID_local;
  int rescale_to_max_local;
  int fake_HDR_format_local;
  char *filename_local;
  
  if (((fake_HDR_format == 0) || (fake_HDR_format == 1)) || (fake_HDR_format == 2)) {
    img._0_4_ = flags;
    img._4_4_ = reuse_texture_ID;
    flags_local = rescale_to_max;
    reuse_texture_ID_local = fake_HDR_format;
    _rescale_to_max_local = filename;
    _height = stbi_hdr_load_rgbe(filename,&channels,(int *)&tex_id,&local_3c,4);
    if (_height == (stbi_uc *)0x0) {
      result_string_pointer = stbi_failure_reason();
      filename_local._4_4_ = 0;
    }
    else {
      if (reuse_texture_ID_local == 1) {
        RGBE_to_RGBdivA(_height,channels,tex_id,flags_local);
      }
      else if (reuse_texture_ID_local == 2) {
        RGBE_to_RGBdivA2(_height,channels,tex_id,flags_local);
      }
      uVar1 = SOIL_internal_create_OGL_texture
                        (_height,channels,tex_id,local_3c,img._4_4_,(uint)img,0xde1,0xde1,0xd33);
      SOIL_free_image_data(_height);
      filename_local._4_4_ = uVar1;
    }
  }
  else {
    result_string_pointer = "Invalid fake HDR format specified";
    filename_local._4_4_ = 0;
  }
  return filename_local._4_4_;
}

Assistant:

unsigned int
	SOIL_load_OGL_HDR_texture
	(
		const char *filename,
		int fake_HDR_format,
		int rescale_to_max,
		unsigned int reuse_texture_ID,
		unsigned int flags
	)
{
	/*	variables	*/
	unsigned char* img;
	int width, height, channels;
	unsigned int tex_id;
	/*	no direct uploading of the image as a DDS file	*/
	/* error check */
	if( (fake_HDR_format != SOIL_HDR_RGBE) &&
		(fake_HDR_format != SOIL_HDR_RGBdivA) &&
		(fake_HDR_format != SOIL_HDR_RGBdivA2) )
	{
		result_string_pointer = "Invalid fake HDR format specified";
		return 0;
	}
	/*	try to load the image (only the HDR type) */
	img = stbi_hdr_load_rgbe( filename, &width, &height, &channels, 4 );
	/*	channels holds the original number of channels, which may have been forced	*/
	if( NULL == img )
	{
		/*	image loading failed	*/
		result_string_pointer = stbi_failure_reason();
		return 0;
	}
	/* the load worked, do I need to convert it? */
	if( fake_HDR_format == SOIL_HDR_RGBdivA )
	{
		RGBE_to_RGBdivA( img, width, height, rescale_to_max );
	} else if( fake_HDR_format == SOIL_HDR_RGBdivA2 )
	{
		RGBE_to_RGBdivA2( img, width, height, rescale_to_max );
	}
	/*	OK, make it a texture!	*/
	tex_id = SOIL_internal_create_OGL_texture(
			img, width, height, channels,
			reuse_texture_ID, flags,
			GL_TEXTURE_2D, GL_TEXTURE_2D,
			GL_MAX_TEXTURE_SIZE );
	/*	and nuke the image data	*/
	SOIL_free_image_data( img );
	/*	and return the handle, such as it is	*/
	return tex_id;
}